

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O0

Expression __thiscall
dynet::SimpleRNNBuilder::add_auxiliary_input(SimpleRNNBuilder *this,Expression *in,Expression *aux)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  ComputationGraph *extraout_RAX;
  ComputationGraph *extraout_RAX_00;
  ComputationGraph *extraout_RAX_01;
  undefined8 *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 *in_RSI;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  Expression EVar5;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *vars;
  uint i;
  Expression x;
  uint t;
  pointer *__x;
  allocator_type *__a;
  size_type in_stack_fffffffffffffdb8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffffdc0;
  ComputationGraph *local_1c8;
  undefined8 local_1c0;
  ComputationGraph *local_1b8;
  undefined8 local_1b0;
  ComputationGraph *local_1a8;
  undefined8 local_1a0;
  ComputationGraph *local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  ComputationGraph *local_178;
  undefined8 local_170;
  ComputationGraph *local_168;
  undefined8 local_160;
  ComputationGraph **local_158;
  undefined8 local_150;
  Expression local_148;
  ComputationGraph *local_138;
  undefined8 local_130;
  ComputationGraph *local_128;
  undefined8 local_120;
  ComputationGraph *local_118;
  undefined8 local_110;
  ComputationGraph *local_108;
  undefined8 local_100;
  ComputationGraph *local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  ComputationGraph *local_d8;
  undefined8 local_d0;
  ComputationGraph *local_c8;
  undefined8 local_c0;
  ComputationGraph **local_b8;
  undefined8 local_b0;
  Expression local_a8;
  ComputationGraph *local_98;
  undefined8 local_90;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_88;
  uint local_7c;
  ComputationGraph *local_78;
  undefined8 local_70;
  allocator_type local_51 [29];
  uint local_34;
  undefined8 *local_30;
  undefined8 *local_28;
  
  __x = &in_RDI[10].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_30 = in_RDX;
  local_28 = in_RSI;
  sVar1 = std::
          vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
          ::size((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                  *)__x);
  local_34 = (uint)sVar1;
  __a = local_51;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xd5ca68);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,__a);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               *)in_RDI,(value_type *)__x);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)__a);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xd5caae);
  local_78 = (ComputationGraph *)*local_28;
  local_70 = local_28[1];
  for (local_7c = 0;
      local_7c <
      *(uint *)&in_RDI[0xc].
                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage; local_7c = local_7c + 1) {
    local_88 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 3),(ulong)local_7c);
    if (local_34 == 0) {
      sVar1 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::size
                        ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                         &in_RDI[0xb].
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar1 == 0) {
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_88,2);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_88,0);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[](local_88,3);
        affine_transform((initializer_list<dynet::Expression> *)0xd5cfdd);
        tanh((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        pvVar3 = std::
                 vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                               *)&in_RDI[10].
                                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34
                             );
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (pvVar3,(ulong)local_7c);
        pvVar4->pg = extraout_RAX_01;
        pvVar4->i = (int)extraout_RDX_01;
        pvVar4->graph_id = (int)((ulong)extraout_RDX_01 >> 0x20);
        local_78 = pvVar4->pg;
        local_70._0_4_ = pvVar4->i;
        local_70._4_4_ = pvVar4->graph_id;
      }
      else {
        pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_88,2);
        local_1c8 = pvVar2->pg;
        local_1c0._0_4_ = pvVar2->i;
        local_1c0._4_4_ = pvVar2->graph_id;
        pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_88,0);
        local_1b8 = pvVar2->pg;
        local_1b0._0_4_ = pvVar2->i;
        local_1b0._4_4_ = pvVar2->graph_id;
        local_1a8 = local_78;
        local_1a0 = local_70;
        pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_88,3);
        local_198 = pvVar2->pg;
        local_190._0_4_ = pvVar2->i;
        local_190._4_4_ = pvVar2->graph_id;
        local_188 = *local_30;
        local_180 = local_30[1];
        pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_88,1);
        local_178 = pvVar2->pg;
        local_170._0_4_ = pvVar2->i;
        local_170._4_4_ = pvVar2->graph_id;
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            &in_RDI[0xb].
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_7c);
        local_168 = pvVar4->pg;
        local_160._0_4_ = pvVar4->i;
        local_160._4_4_ = pvVar4->graph_id;
        local_158 = &local_1c8;
        local_150 = 7;
        local_148 = affine_transform((initializer_list<dynet::Expression> *)0xd5ce9a);
        tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        local_138 = extraout_RAX_00;
        local_130 = extraout_RDX_00;
        pvVar3 = std::
                 vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                               *)&in_RDI[10].
                                  super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34
                             );
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (pvVar3,(ulong)local_7c);
        pvVar4->pg = local_138;
        pvVar4->i = (undefined4)local_130;
        pvVar4->graph_id = local_130._4_4_;
        local_78 = pvVar4->pg;
        local_70._0_4_ = pvVar4->i;
        local_70._4_4_ = pvVar4->graph_id;
      }
    }
    else {
      pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,2);
      local_128 = pvVar2->pg;
      local_120._0_4_ = pvVar2->i;
      local_120._4_4_ = pvVar2->graph_id;
      pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,0);
      local_118 = pvVar2->pg;
      local_110._0_4_ = pvVar2->i;
      local_110._4_4_ = pvVar2->graph_id;
      local_108 = local_78;
      local_100 = local_70;
      pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,3);
      local_f8 = pvVar2->pg;
      local_f0._0_4_ = pvVar2->i;
      local_f0._4_4_ = pvVar2->graph_id;
      local_e8 = *local_30;
      local_e0 = local_30[1];
      pvVar2 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_88,1);
      local_d8 = pvVar2->pg;
      local_d0._0_4_ = pvVar2->i;
      local_d0._4_4_ = pvVar2->graph_id;
      pvVar3 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)&in_RDI[10].
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (ulong)(local_34 - 1));
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (pvVar3,(ulong)local_7c);
      local_c8 = pvVar4->pg;
      local_c0._0_4_ = pvVar4->i;
      local_c0._4_4_ = pvVar4->graph_id;
      local_b8 = &local_128;
      local_b0 = 7;
      local_a8 = affine_transform((initializer_list<dynet::Expression> *)0xd5cc6f);
      tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      local_98 = extraout_RAX;
      local_90 = extraout_RDX;
      pvVar3 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)&in_RDI[10].
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (pvVar3,(ulong)local_7c);
      pvVar4->pg = local_98;
      pvVar4->i = (undefined4)local_90;
      pvVar4->graph_id = local_90._4_4_;
      local_78 = pvVar4->pg;
      local_70._0_4_ = pvVar4->i;
      local_70._4_4_ = pvVar4->graph_id;
    }
  }
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                *)&in_RDI[10].
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage,(ulong)local_34);
  pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back(in_RDI);
  EVar5.pg = pvVar4->pg;
  EVar5.i = pvVar4->i;
  EVar5.graph_id = pvVar4->graph_id;
  return EVar5;
}

Assistant:

Expression SimpleRNNBuilder::add_auxiliary_input(const Expression &in, const Expression &aux) {
  const unsigned t = h.size();
  h.push_back(vector<Expression>(layers));

  Expression x = in;

  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    DYNET_ASSERT(vars.size() >= L2H + 1, "Failed dimension check in SimpleRNNBuilder");

    if(t > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h[t-1][i]}) );
    } else if(h0.size() > 0) {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux, vars[H2H], h0[i]}) );
    } else {
      x = h[t][i] = tanh( affine_transform({vars[HB], vars[X2H], x, vars[L2H], aux}) );
    }

  }
  return h[t].back();
}